

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlCatalogConvert(void)

{
  int val;
  int ret_val;
  int test_ret;
  
  val = xmlCatalogConvert();
  desret_int(val);
  call_tests = call_tests + 1;
  xmlResetLastError();
  function_tests = function_tests + 1;
  return 0;
}

Assistant:

static int
test_xmlCatalogConvert(void) {
    int test_ret = 0;

#if defined(LIBXML_CATALOG_ENABLED)
    int ret_val;


        ret_val = xmlCatalogConvert();
        desret_int(ret_val);
        call_tests++;
        xmlResetLastError();
    function_tests++;
#endif

    return(test_ret);
}